

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O3

uint32_t __thiscall kaitai::kstream::read_u4le(kstream *this)

{
  uint32_t t;
  uint32_t local_c;
  
  std::istream::read((char *)this->m_io,(long)&local_c);
  return local_c;
}

Assistant:

uint32_t kaitai::kstream::read_u4le() {
    uint32_t t;
    m_io->read(reinterpret_cast<char *>(&t), 4);
#if __BYTE_ORDER == __BIG_ENDIAN
    t = bswap_32(t);
#endif
    return t;
}